

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3JoinType(Parse *pParse,Token *pA,Token *pB,Token *pC)

{
  uint uVar1;
  Token *pTVar2;
  uint uVar3;
  char *pcVar4;
  uchar uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uchar uVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  long in_FS_OFFSET;
  Token *local_58 [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58[0] = pA;
  local_58[1] = pB;
  local_58[2] = pC;
  lVar8 = 0;
  uVar3 = 0;
LAB_0016a35a:
  pTVar2 = local_58[lVar8];
  if (pTVar2 != (Token *)0x0) {
    uVar1 = pTVar2->n;
    lVar12 = 0;
    do {
      if ((uVar1 == sqlite3JoinType::aKeyword[lVar12].nChar) && (pTVar2->z != (char *)0x0)) {
        if (uVar1 == 0) goto LAB_0016a3f0;
        lVar10 = 0;
        uVar7 = uVar1 + 1;
        while (uVar6 = (ulong)(byte)pTVar2->z[lVar10], uVar6 != 0) {
          uVar9 = ""[uVar6];
          uVar5 = ""[(byte)"naturaleftouterightfullinnercross"
                           [(ulong)sqlite3JoinType::aKeyword[lVar12].i + lVar10]];
          if (uVar9 != uVar5) goto LAB_0016a3de;
          uVar7 = uVar7 - 1;
          lVar10 = lVar10 + 1;
          if (uVar7 < 2) goto LAB_0016a3f0;
        }
        uVar5 = ""[(byte)"naturaleftouterightfullinnercross"
                         [(ulong)sqlite3JoinType::aKeyword[lVar12].i + lVar10]];
        uVar9 = '\0';
LAB_0016a3de:
        if (uVar9 == uVar5) goto LAB_0016a3f0;
      }
      lVar12 = lVar12 + 1;
      if (lVar12 == 7) {
        uVar3 = uVar3 | 0x80;
        break;
      }
    } while( true );
  }
  goto LAB_0016a40c;
LAB_0016a3f0:
  uVar3 = uVar3 | sqlite3JoinType::aKeyword[lVar12].code;
  lVar8 = lVar8 + 1;
  if (lVar8 == 3) {
LAB_0016a40c:
    if ((((uVar3 & 0x38) == 0x20) || ((uVar3 & 0x21) == 0x21)) || ((uVar3 & 0x80) != 0)) {
      pcVar4 = " ";
      if (pB == (Token *)0x0) {
        pcVar4 = "";
      }
      if (pC == (Token *)0x0) {
        pC = (Token *)0x0;
        pcVar11 = "";
      }
      else {
        pcVar11 = " ";
      }
      sqlite3ErrorMsg(pParse,"unknown join type: %T%s%T%s%T",pA,pcVar4,pB,pcVar11,pC);
      uVar3 = 1;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return uVar3;
  }
  goto LAB_0016a35a;
}

Assistant:

SQLITE_PRIVATE int sqlite3JoinType(Parse *pParse, Token *pA, Token *pB, Token *pC){
  int jointype = 0;
  Token *apAll[3];
  Token *p;
                             /*   0123456789 123456789 123456789 123 */
  static const char zKeyText[] = "naturaleftouterightfullinnercross";
  static const struct {
    u8 i;        /* Beginning of keyword text in zKeyText[] */
    u8 nChar;    /* Length of the keyword in characters */
    u8 code;     /* Join type mask */
  } aKeyword[] = {
    /* (0) natural */ { 0,  7, JT_NATURAL                },
    /* (1) left    */ { 6,  4, JT_LEFT|JT_OUTER          },
    /* (2) outer   */ { 10, 5, JT_OUTER                  },
    /* (3) right   */ { 14, 5, JT_RIGHT|JT_OUTER         },
    /* (4) full    */ { 19, 4, JT_LEFT|JT_RIGHT|JT_OUTER },
    /* (5) inner   */ { 23, 5, JT_INNER                  },
    /* (6) cross   */ { 28, 5, JT_INNER|JT_CROSS         },
  };
  int i, j;
  apAll[0] = pA;
  apAll[1] = pB;
  apAll[2] = pC;
  for(i=0; i<3 && apAll[i]; i++){
    p = apAll[i];
    for(j=0; j<ArraySize(aKeyword); j++){
      if( p->n==aKeyword[j].nChar
          && sqlite3StrNICmp((char*)p->z, &zKeyText[aKeyword[j].i], p->n)==0 ){
        jointype |= aKeyword[j].code;
        break;
      }
    }
    testcase( j==0 || j==1 || j==2 || j==3 || j==4 || j==5 || j==6 );
    if( j>=ArraySize(aKeyword) ){
      jointype |= JT_ERROR;
      break;
    }
  }
  if(
     (jointype & (JT_INNER|JT_OUTER))==(JT_INNER|JT_OUTER) ||
     (jointype & JT_ERROR)!=0 ||
     (jointype & (JT_OUTER|JT_LEFT|JT_RIGHT))==JT_OUTER
  ){
    const char *zSp1 = " ";
    const char *zSp2 = " ";
    if( pB==0 ){ zSp1++; }
    if( pC==0 ){ zSp2++; }
    sqlite3ErrorMsg(pParse, "unknown join type: "
       "%T%s%T%s%T", pA, zSp1, pB, zSp2, pC);
    jointype = JT_INNER;
  }
  return jointype;
}